

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_source_panner.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
ear::real_quadratic_roots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,double a,double b,
          double c)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  ulong in_XMM0_Qb;
  ulong extraout_XMM0_Qb;
  undefined1 auVar4 [16];
  ulong in_XMM1_Qb;
  double __x;
  double dVar5;
  ulong uVar6;
  double dVar7;
  initializer_list<double> __l;
  size_type sStack_80;
  allocator_type local_69;
  double local_68;
  ulong uStack_60;
  double local_58;
  undefined1 local_48 [16];
  double local_38;
  double local_28;
  ulong uStack_20;
  double local_18;
  ulong uStack_10;
  
  if (1e-10 <= ABS(c)) {
    uVar6 = in_XMM0_Qb & 0x7fffffffffffffff;
    if (ABS(a) < 1e-10) {
      local_48._8_8_ = local_48._0_8_;
      local_48._0_8_ = -c / b;
    }
    else {
      __x = b * b + a * -4.0 * c;
      if (1e-10 < __x) {
        local_18 = -b;
        uStack_10 = in_XMM1_Qb ^ 0x8000000000000000;
        dVar5 = SQRT(__x);
        dVar3 = dVar5;
        local_38 = b;
        if (__x < 0.0) {
          local_68 = __x;
          uStack_60 = in_XMM1_Qb;
          local_58 = a;
          local_28 = dVar5;
          uStack_20 = uVar6;
          dVar5 = sqrt(__x);
          __x = local_68;
          dVar3 = local_28;
          a = local_58;
          uVar6 = extraout_XMM0_Qb;
        }
        dVar7 = a + a;
        if (__x < 0.0) {
          local_68 = dVar5;
          uStack_60 = uVar6;
          local_58 = a + a;
          dVar3 = sqrt(__x);
          dVar7 = local_58;
          dVar5 = local_68;
        }
        auVar4._0_8_ = dVar5 - local_38;
        auVar4._8_8_ = local_18 - dVar3;
        auVar1._8_8_ = dVar7;
        auVar1._0_8_ = dVar7;
        local_48 = divpd(auVar4,auVar1);
        sStack_80 = 2;
        goto LAB_00137b30;
      }
      if (__x <= -1e-10) {
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        return __return_storage_ptr__;
      }
      local_48._8_8_ = local_48._0_8_;
      local_48._0_8_ = -b / (a + a);
    }
  }
  else {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_48._0_8_;
    local_48 = auVar2 << 0x40;
  }
  sStack_80 = 1;
LAB_00137b30:
  __l._M_array = (iterator)local_48;
  __l._M_len = sStack_80;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,__l,&local_69);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> real_quadratic_roots(double a, double b, double c) {
    double eps = 1e-10;

    if (std::abs(c) < eps) return {0.0};
    if (std::abs(a) < eps) return {-c / b};

    double det = b * b - 4.0 * a * c;
    if (det > eps)
      return {(-b + sqrt(det)) / (2.0 * a), (-b - sqrt(det)) / (2.0 * a)};
    else if (det > -eps)
      return {-b / (2.0 * a)};
    else
      return {};
  }